

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

ScriptBuilder * __thiscall
cfd::core::ScriptBuilder::AppendString(ScriptBuilder *this,string *message)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  bool local_129;
  ByteData local_110;
  uint local_f4;
  long local_f0;
  undefined1 local_e8 [8];
  string str;
  undefined1 local_c0 [4];
  int int_value;
  ByteData local_a0;
  byte local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  ScriptOperator local_50;
  string *local_20;
  string *message_local;
  ScriptBuilder *this_local;
  
  local_20 = message;
  message_local = (string *)this;
  bVar1 = ScriptOperator::IsValid(message);
  if (bVar1) {
    ScriptOperator::Get(&local_50,local_20);
    this_local = AppendOperator(this,&local_50);
    ScriptOperator::~ScriptOperator(&local_50);
  }
  else {
    uVar4 = ::std::__cxx11::string::length();
    local_81 = 0;
    local_129 = false;
    if (2 < uVar4) {
      ::std::__cxx11::string::substr((ulong)&local_80,(ulong)local_20);
      local_81 = 1;
      local_129 = ::std::operator==(&local_80,"0x");
    }
    if ((local_81 & 1) != 0) {
      ::std::__cxx11::string::~string((string *)&local_80);
    }
    if (local_129 == false) {
      pcVar5 = (char *)::std::__cxx11::string::c_str();
      iVar3 = atoi(pcVar5);
      if (iVar3 != 0) {
        pcVar5 = (char *)::std::__cxx11::string::c_str();
        str.field_2._12_4_ = atoi(pcVar5);
        ::std::__cxx11::to_string((string *)local_e8,str.field_2._12_4_);
        _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_e8,local_20);
        if (_Var2) {
          local_f0 = (long)(int)str.field_2._12_4_;
          this_local = AppendData(this,&local_f0);
        }
        local_f4 = (uint)_Var2;
        ::std::__cxx11::string::~string((string *)local_e8);
        if (local_f4 != 0) {
          return this_local;
        }
      }
      ByteData::ByteData(&local_110,local_20);
      this_local = AppendData(this,&local_110);
      ByteData::~ByteData(&local_110);
    }
    else {
      ::std::__cxx11::string::substr((ulong)local_c0,(ulong)local_20);
      ByteData::ByteData(&local_a0,(string *)local_c0);
      this_local = AppendData(this,&local_a0);
      ByteData::~ByteData(&local_a0);
      ::std::__cxx11::string::~string((string *)local_c0);
    }
  }
  return this_local;
}

Assistant:

ScriptBuilder& ScriptBuilder::AppendString(const std::string& message) {
  if (ScriptOperator::IsValid(message)) {
    return AppendOperator(ScriptOperator::Get(message));
  } else if ((message.length() > 2) && (message.substr(0, 2) == "0x")) {
    // to hex
    return AppendData(ByteData(message.substr(2)));
  } else {
    if (std::atoi(message.c_str()) != 0) {  // check number
      int int_value = std::atoi(message.c_str());
      std::string str = std::to_string(int_value);
      if (str == message) {
        return AppendData(static_cast<int64_t>(int_value));
      }
    }
    // hex string check (force)
    return AppendData(ByteData(message));
  }
}